

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O3

bool SignSignature(SigningProvider *provider,CTransaction *txFrom,CMutableTransaction *txTo,uint nIn
                  ,int nHashType,SignatureData *sig_data)

{
  pointer pCVar1;
  pointer pCVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  
  uVar5 = (ulong)nIn;
  pCVar1 = (txTo->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = ((long)(txTo->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pCVar1 >> 3) * 0x4ec4ec4ec4ec4ec5;
  if (uVar4 < uVar5 || uVar4 - uVar5 == 0) {
    __assert_fail("nIn < txTo.vin.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/sign.cpp"
                  ,0x2c6,
                  "bool SignSignature(const SigningProvider &, const CTransaction &, CMutableTransaction &, unsigned int, int, SignatureData &)"
                 );
  }
  uVar4 = (ulong)pCVar1[uVar5].prevout.n;
  pCVar2 = (txFrom->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = ((long)(txFrom->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pCVar2 >> 3) * -0x3333333333333333;
  if (uVar4 <= uVar5 && uVar5 - uVar4 != 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
      bVar3 = SignSignature(provider,&pCVar2[uVar4].scriptPubKey,txTo,nIn,&pCVar2[uVar4].nValue,
                            nHashType,sig_data);
      return bVar3;
    }
    __stack_chk_fail();
  }
  __assert_fail("txin.prevout.n < txFrom.vout.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/sign.cpp"
                ,0x2c8,
                "bool SignSignature(const SigningProvider &, const CTransaction &, CMutableTransaction &, unsigned int, int, SignatureData &)"
               );
}

Assistant:

bool SignSignature(const SigningProvider &provider, const CTransaction& txFrom, CMutableTransaction& txTo, unsigned int nIn, int nHashType, SignatureData& sig_data)
{
    assert(nIn < txTo.vin.size());
    const CTxIn& txin = txTo.vin[nIn];
    assert(txin.prevout.n < txFrom.vout.size());
    const CTxOut& txout = txFrom.vout[txin.prevout.n];

    return SignSignature(provider, txout.scriptPubKey, txTo, nIn, txout.nValue, nHashType, sig_data);
}